

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O2

void __thiscall
re2::PCRE::Init(PCRE *this,char *pattern,Option options,int match_limit,int stack_limit,
               bool report_errors)

{
  string *this_00;
  ostream *poVar1;
  LogMessage local_1b0;
  
  std::__cxx11::string::assign((char *)this);
  this->options_ = options;
  this->match_limit_ = match_limit;
  this->stack_limit_ = stack_limit;
  this->hit_limit_ = 0;
  this->error_ = (string *)empty_string_abi_cxx11_;
  this->report_errors_ = report_errors;
  this->re_full_ = (pcre *)0x0;
  this->re_partial_ = (pcre *)0x0;
  if ((options & ~EnabledCompileOptions) == EnabledExecOptions) {
    Compile(this,UNANCHORED);
    this->re_partial_ = (pcre *)0x0;
  }
  else {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00,"illegal regexp option",(allocator *)&local_1b0);
    this->error_ = this_00;
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",0x66,
               2);
    poVar1 = std::operator<<((ostream *)&local_1b0.str_,"Error compiling \'");
    poVar1 = std::operator<<(poVar1,pattern);
    std::operator<<(poVar1,"\': illegal regexp option");
    LogMessage::~LogMessage(&local_1b0);
  }
  return;
}

Assistant:

void PCRE::Init(const char* pattern, Option options, int match_limit,
              int stack_limit, bool report_errors) {
  pattern_ = pattern;
  options_ = options;
  match_limit_ = match_limit;
  stack_limit_ = stack_limit;
  hit_limit_ = false;
  error_ = &empty_string;
  report_errors_ = report_errors;
  re_full_ = NULL;
  re_partial_ = NULL;

  if (options & ~(EnabledCompileOptions | EnabledExecOptions)) {
    error_ = new string("illegal regexp option");
    PCREPORT(ERROR)
        << "Error compiling '" << pattern << "': illegal regexp option";
  } else {
    re_partial_ = Compile(UNANCHORED);
    if (re_partial_ != NULL) {
      re_full_ = Compile(ANCHOR_BOTH);
    }
  }
}